

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_weakref(HSQUIRRELVM v,SQInteger idx)

{
  SQInteger this;
  SQWeakRef *x;
  SQObjectPtr local_50 [2];
  SQObjectPtr local_30;
  SQObject *local_20;
  SQObject *o;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  o = (SQObject *)idx;
  idx_local = (SQInteger)v;
  local_20 = &stack_get(v,idx)->super_SQObject;
  this = idx_local;
  if ((local_20->_type & 0x8000000) == 0) {
    SQObjectPtr::SQObjectPtr(local_50,local_20);
    SQVM::Push((SQVM *)this,local_50);
    SQObjectPtr::~SQObjectPtr(local_50);
  }
  else {
    x = SQRefCounted::GetWeakRef((local_20->_unVal).pRefCounted,local_20->_type);
    SQObjectPtr::SQObjectPtr(&local_30,x);
    SQVM::Push((SQVM *)this,&local_30);
    SQObjectPtr::~SQObjectPtr(&local_30);
  }
  return;
}

Assistant:

void sq_weakref(HSQUIRRELVM v,SQInteger idx)
{
    SQObject &o=stack_get(v,idx);
    if(ISREFCOUNTED(type(o))) {
        v->Push(_refcounted(o)->GetWeakRef(type(o)));
        return;
    }
    v->Push(o);
}